

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3FkRequired(Parse *pParse,Table *pTab,int *aChange,int chngRowid)

{
  byte bVar1;
  int iVar2;
  byte *pbVar3;
  FKey *pFVar4;
  uint uVar5;
  long lVar6;
  byte *pbVar7;
  byte *pbVar8;
  ulong uVar9;
  
  uVar5 = 0;
  if ((pParse->db->flags & 0x40000) != 0) {
    if (aChange == (int *)0x0) {
      pFVar4 = sqlite3FkReferences(pTab);
      uVar5 = 1;
      if (pFVar4 == (FKey *)0x0) {
        uVar5 = (uint)(pTab->pFKey != (FKey *)0x0);
      }
    }
    else {
      for (pFVar4 = pTab->pFKey; pFVar4 != (FKey *)0x0; pFVar4 = pFVar4->pNextFrom) {
        if (0 < (long)pFVar4->nCol) {
          lVar6 = 0;
          do {
            iVar2 = *(int *)((long)&pFVar4->aCol[0].iFrom + lVar6);
            if (-1 < aChange[iVar2]) {
              return 1;
            }
            if ((chngRowid != 0) && (iVar2 == pTab->iPKey)) {
              return 1;
            }
            lVar6 = lVar6 + 0x10;
          } while ((long)pFVar4->nCol * 0x10 != lVar6);
        }
      }
      for (pFVar4 = sqlite3FkReferences(pTab); uVar5 = 0, pFVar4 != (FKey *)0x0;
          pFVar4 = pFVar4->pNextTo) {
        if (0 < (long)pFVar4->nCol) {
          lVar6 = 0;
          do {
            if (0 < pTab->nCol) {
              pbVar3 = (byte *)pFVar4->aCol[lVar6].zCol;
              uVar9 = 0;
              do {
                if (pbVar3 == (byte *)0x0) {
                  if ((pTab->aCol[uVar9].colFlags & 1) != 0) goto LAB_00199f90;
                }
                else {
                  pbVar8 = (byte *)pTab->aCol[uVar9].zName;
                  bVar1 = *pbVar8;
                  pbVar7 = pbVar3;
                  while ((bVar1 != 0 && (pbVar8 = pbVar8 + 1, ""[bVar1] == ""[*pbVar7]))) {
                    pbVar7 = pbVar7 + 1;
                    bVar1 = *pbVar8;
                  }
                  if (""[bVar1] == ""[*pbVar7]) {
LAB_00199f90:
                    if (-1 < aChange[uVar9]) {
                      return 1;
                    }
                    if ((chngRowid != 0) && (uVar9 == (uint)(int)pTab->iPKey)) {
                      return 1;
                    }
                  }
                }
                uVar9 = uVar9 + 1;
              } while (uVar9 != (long)pTab->nCol);
            }
            lVar6 = lVar6 + 1;
          } while (lVar6 != pFVar4->nCol);
        }
      }
    }
  }
  return uVar5;
}

Assistant:

SQLITE_PRIVATE int sqlite3FkRequired(
  Parse *pParse,                  /* Parse context */
  Table *pTab,                    /* Table being modified */
  int *aChange,                   /* Non-NULL for UPDATE operations */
  int chngRowid                   /* True for UPDATE that affects rowid */
){
  if( pParse->db->flags&SQLITE_ForeignKeys ){
    if( !aChange ){
      /* A DELETE operation. Foreign key processing is required if the 
      ** table in question is either the child or parent table for any 
      ** foreign key constraint.  */
      return (sqlite3FkReferences(pTab) || pTab->pFKey);
    }else{
      /* This is an UPDATE. Foreign key processing is only required if the
      ** operation modifies one or more child or parent key columns. */
      int i;
      FKey *p;

      /* Check if any child key columns are being modified. */
      for(p=pTab->pFKey; p; p=p->pNextFrom){
        for(i=0; i<p->nCol; i++){
          int iChildKey = p->aCol[i].iFrom;
          if( aChange[iChildKey]>=0 ) return 1;
          if( iChildKey==pTab->iPKey && chngRowid ) return 1;
        }
      }

      /* Check if any parent key columns are being modified. */
      for(p=sqlite3FkReferences(pTab); p; p=p->pNextTo){
        for(i=0; i<p->nCol; i++){
          char *zKey = p->aCol[i].zCol;
          int iKey;
          for(iKey=0; iKey<pTab->nCol; iKey++){
            Column *pCol = &pTab->aCol[iKey];
            if( (zKey ? !sqlite3StrICmp(pCol->zName, zKey)
                      : (pCol->colFlags & COLFLAG_PRIMKEY)!=0) ){
              if( aChange[iKey]>=0 ) return 1;
              if( iKey==pTab->iPKey && chngRowid ) return 1;
            }
          }
        }
      }
    }
  }
  return 0;
}